

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O3

void __thiscall gui::Slider::updateThumb(Slider *this,float thumbPosition)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = this->step_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar3 = (this->size_).x;
    fVar2 = floorf(((this->range_).second - (this->range_).first) / fVar1);
    fVar2 = fVar2 + 1.0;
  }
  else {
    fVar2 = (this->size_).x;
    fVar3 = fVar2;
  }
  fVar4 = ((this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          thumbMinWidth_;
  if (fVar4 <= fVar3 / fVar2) {
    fVar4 = fVar3 / fVar2;
  }
  fVar3 = (fVar4 * -0.5 + thumbPosition) / (fVar3 - fVar4);
  fVar2 = 0.0;
  if (0.0 <= fVar3) {
    fVar2 = fVar3;
  }
  fVar3 = 1.0;
  if (fVar2 <= 1.0) {
    fVar3 = fVar2;
  }
  fVar2 = (this->range_).first;
  fVar4 = (this->range_).second - fVar2;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar4 = floorf(fVar4 / fVar1);
    fVar4 = roundf((fVar4 + 1.0 + -1.0) * fVar3);
    fVar4 = fVar4 * fVar1;
  }
  else {
    fVar4 = fVar4 * fVar3;
  }
  setValue(this,fVar4 + fVar2);
  return;
}

Assistant:

void Slider::updateThumb(float thumbPosition) {
    const float thumbWidth = getThumbWidth();
    const float thumbNormalized = std::min(std::max((thumbPosition - 0.5f * thumbWidth) / (size_.x - thumbWidth), 0.0f), 1.0f);

    if (step_ == 0.0f) {
        setValue((range_.second - range_.first) * thumbNormalized + range_.first);
    } else {
        float numThumbPositions = std::floor((range_.second - range_.first) / step_) + 1.0f;
        setValue(std::round(thumbNormalized * (numThumbPositions - 1.0f)) * step_ + range_.first);
    }
}